

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O2

bool __thiscall
TrackedObject<51U,_1000U>::TryGetRandomLocation(TrackedObject<51U,_1000U> *this,Location *location)

{
  uint uVar1;
  uint uVar2;
  Location LVar3;
  
  uVar1 = this->count;
  uVar2 = PAL_rand();
  LVar3 = Location::Tagged((RecyclerTestObject **)
                           (&this[1].super_RecyclerTestObject.super_IRecyclerVisitedObject +
                           (ulong)uVar2 % (ulong)uVar1));
  location->location = LVar3.location;
  location->type = LVar3.type;
  return true;
}

Assistant:

virtual bool TryGetRandomLocation(Location * location) override
    {
        // Get a random slot and construct a Location for it
        *location = Location::Tagged(&references[GetRandomInteger(count)]);

        return true;
    }